

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
             *this,back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> __result;
  __type _Var1;
  
  __result = (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)it->container;
  if (*(long *)(this + 0x10) != 0) {
    __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                         (*(char **)(this + 8),*(char **)(this + 8) + *(long *)(this + 0x10),
                          __result);
    it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)__result;
  }
  _Var1 = std::
          __fill_n_a1<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long,wchar_t>
                    (__result,*(unsigned_long *)(this + 0x20),(wchar_t *)(this + 0x18));
  it->container = _Var1.container;
  int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }